

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

element * __thiscall MinVR::element::operator=(element *this,element *the_element)

{
  string local_50;
  _List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_> local_30;
  
  set_name(this,the_element->m_name);
  std::__cxx11::string::string((string *)&local_50,(string *)&the_element->m_value);
  set_value(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::list
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&local_30,
             &the_element->m_element_list);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_move_assign
            (&this->m_element_list,&local_30);
  std::__cxx11::_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_clear(&local_30)
  ;
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::list
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)&local_30,
             &the_element->m_attribute_list);
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_move_assign
            (&this->m_attribute_list,
             (_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)&local_30);
  std::__cxx11::_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_clear
            ((_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)&local_30);
  return this;
}

Assistant:

element* element::operator = ( element* the_element)
{
    set_name(the_element->get_name());
    set_value(the_element->get_value());
    m_element_list = the_element->get_element_list();
    m_attribute_list = the_element->get_attribute_list();
    return this;
}